

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::AudioTrack::Write(AudioTrack *this,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64 uVar4;
  uint64 uVar5;
  int extraout_var;
  int extraout_var_00;
  
  bVar1 = Track::Write(&this->super_Track,writer);
  if (bVar1) {
    uVar4 = EbmlElementSize(0xb5,(float)this->sample_rate_);
    uVar5 = EbmlElementSize(0x9f,this->channels_);
    uVar5 = uVar5 + uVar4;
    if (this->bit_depth_ != 0) {
      uVar4 = EbmlElementSize(0x6264,this->bit_depth_);
      uVar5 = uVar5 + uVar4;
    }
    bVar1 = WriteEbmlMasterElement(writer,0xe1,uVar5);
    if (bVar1) {
      iVar2 = (*writer->_vptr_IMkvWriter[1])(writer);
      if ((((-1 < extraout_var) &&
           (bVar1 = WriteEbmlElement(writer,0xb5,(float)this->sample_rate_), bVar1)) &&
          (bVar1 = WriteEbmlElement(writer,0x9f,this->channels_), bVar1)) &&
         ((this->bit_depth_ == 0 ||
          (bVar1 = WriteEbmlElement(writer,0x6264,this->bit_depth_), bVar1)))) {
        iVar3 = (*writer->_vptr_IMkvWriter[1])(writer);
        return CONCAT44(extraout_var_00,iVar3) - CONCAT44(extraout_var,iVar2) == uVar5 &&
               -1 < extraout_var_00;
      }
    }
  }
  return false;
}

Assistant:

bool AudioTrack::Write(IMkvWriter* writer) const {
  if (!Track::Write(writer))
    return false;

  // Calculate AudioSettings size.
  uint64_t size = EbmlElementSize(libwebm::kMkvSamplingFrequency,
                                  static_cast<float>(sample_rate_));
  size +=
      EbmlElementSize(libwebm::kMkvChannels, static_cast<uint64>(channels_));
  if (bit_depth_ > 0)
    size +=
        EbmlElementSize(libwebm::kMkvBitDepth, static_cast<uint64>(bit_depth_));

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvAudio, size))
    return false;

  const int64_t payload_position = writer->Position();
  if (payload_position < 0)
    return false;

  if (!WriteEbmlElement(writer, libwebm::kMkvSamplingFrequency,
                        static_cast<float>(sample_rate_)))
    return false;
  if (!WriteEbmlElement(writer, libwebm::kMkvChannels,
                        static_cast<uint64>(channels_)))
    return false;
  if (bit_depth_ > 0)
    if (!WriteEbmlElement(writer, libwebm::kMkvBitDepth,
                          static_cast<uint64>(bit_depth_)))
      return false;

  const int64_t stop_position = writer->Position();
  if (stop_position < 0 ||
      stop_position - payload_position != static_cast<int64_t>(size))
    return false;

  return true;
}